

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadControllerLibrary(ColladaParser *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  mapped_type *pmVar4;
  undefined4 extraout_var_00;
  allocator local_209;
  string local_208;
  Controller local_1e8;
  allocator local_39;
  undefined1 local_38 [8];
  string id;
  int attrID;
  ColladaParser *this_local;
  
  uVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar2 & 1) == 0) {
    do {
      while( true ) {
        uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((uVar2 & 1) == 0) {
          return;
        }
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar3 != 1) break;
        bVar1 = IsElement(this,"controller");
        if (bVar1) {
          id.field_2._12_4_ = GetAttribute(this,"id");
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])
                            (this->mReader,(ulong)(uint)id.field_2._12_4_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_38,(char *)CONCAT44(extraout_var,iVar3),&local_39);
          std::allocator<char>::~allocator((allocator<char> *)&local_39);
          memset(&local_1e8,0,0x198);
          Collada::Controller::Controller(&local_1e8);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller>_>_>
                   ::operator[](&this->mControllerLibrary,(key_type *)local_38);
          Collada::Controller::operator=(pmVar4,&local_1e8);
          Collada::Controller::~Controller(&local_1e8);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller>_>_>
                   ::operator[](&this->mControllerLibrary,(key_type *)local_38);
          ReadController(this,pmVar4);
          std::__cxx11::string::~string((string *)local_38);
        }
        else {
          SkipElement(this);
        }
      }
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar3 != 2);
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar3 = strcmp((char *)CONCAT44(extraout_var_00,iVar3),"library_controllers");
    if (iVar3 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_208,"Expected end of <library_controllers> element.",&local_209);
      ThrowException(this,&local_208);
    }
  }
  return;
}

Assistant:

void ColladaParser::ReadControllerLibrary()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("controller"))
            {
                // read ID. Ask the spec if it's necessary or optional... you might be surprised.
                int attrID = GetAttribute("id");
                std::string id = mReader->getAttributeValue(attrID);

                // create an entry and store it in the library under its ID
                mControllerLibrary[id] = Controller();

                // read on from there
                ReadController(mControllerLibrary[id]);
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "library_controllers") != 0)
                ThrowException("Expected end of <library_controllers> element.");

            break;
        }
    }
}